

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statamain.cpp
# Opt level: O0

int myprintf(char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_4e8 [8];
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined4 local_438;
  undefined4 local_434;
  va_list args;
  char local_418 [8];
  char buf [1024];
  int ret;
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_4e8;
  args[0]._0_8_ = &stack0x00000008;
  local_434 = 0x30;
  local_438 = 8;
  local_4e0 = in_RSI;
  local_4d8 = in_RDX;
  local_4d0 = in_RCX;
  local_4c8 = in_R8;
  local_4c0 = in_R9;
  buf._1020_4_ = vsnprintf(local_418,0x400,fmt,&local_438);
  (*_stata_->spoutsml)(local_418);
  iVar1._0_1_ = buf[0x3fc];
  iVar1._1_1_ = buf[0x3fd];
  iVar1._2_1_ = buf[0x3fe];
  iVar1._3_1_ = buf[0x3ff];
  return iVar1;
}

Assistant:

int myprintf(const char *fmt, ...)
{
	int ret;
    char buf[1024];

    va_list args;
    va_start(args, fmt);
    ret = vsnprintf(buf, sizeof(buf), fmt, args);
    SF_display(buf);
    va_end(args);
	return ret;
}